

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_tests.cpp
# Opt level: O3

void (anonymous_namespace)::TestPotentialDeadLockDetected<AnnotatedMixin<std::recursive_mutex>>
               (AnnotatedMixin<std::recursive_mutex> *mutex1,
               AnnotatedMixin<std::recursive_mutex> *mutex2)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  check_type cVar3;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  unique_lock<std::recursive_mutex> local_70;
  undefined1 *local_60;
  char **local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70._M_owns = false;
  local_70._M_device = &mutex1->super_recursive_mutex;
  std::unique_lock<std::recursive_mutex>::lock(&local_70);
  local_50.m_message.px = (element_type *)((ulong)local_50.m_message.px & 0xffffffffffffff00);
  local_50._0_8_ = mutex2;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_50);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_50);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_70);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sync_tests.cpp";
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x14;
  file.m_begin = (iterator)&local_80;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_90,msg);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "LockStackEmpty()";
  local_98 = "";
  local_70._M_owns = false;
  local_70._M_device = (mutex_type *)&PTR__lazy_ostream_013ae1c8;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sync_tests.cpp";
  local_a8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_58 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)&local_70,1,0,WARN,_cVar3,(size_t)&local_b0,0x14);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_70._M_owns = false;
  local_70._M_device = &mutex2->super_recursive_mutex;
  std::unique_lock<std::recursive_mutex>::lock(&local_70);
  local_50.m_message.px = (element_type *)((ulong)local_50.m_message.px & 0xffffffffffffff00);
  local_50._0_8_ = mutex1;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_50);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_50);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_70);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sync_tests.cpp";
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1c;
  file_00.m_begin = (iterator)&local_f0;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
             msg_00);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "LockStackEmpty()";
  local_98 = "";
  local_70._M_owns = false;
  local_70._M_device = (mutex_type *)&PTR__lazy_ostream_013ae1c8;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sync_tests.cpp";
  local_108 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_58 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)&local_70,1,0,WARN,_cVar3,(size_t)&local_110,0x1c);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sync_tests.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x20;
  file_01.m_begin = (iterator)&local_120;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_130,
             msg_01);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!error_thrown";
  local_98 = "";
  local_70._M_owns = false;
  local_70._M_device = (mutex_type *)&PTR__lazy_ostream_013ae1c8;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sync_tests.cpp";
  local_138 = "";
  local_58 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)&local_70,1,0,WARN,_cVar3,(size_t)&local_140,0x20);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestPotentialDeadLockDetected(MutexType& mutex1, MutexType& mutex2)
{
    {
        LOCK2(mutex1, mutex2);
    }
    BOOST_CHECK(LockStackEmpty());
    bool error_thrown = false;
    try {
        LOCK2(mutex2, mutex1);
    } catch (const std::logic_error& e) {
        BOOST_CHECK_EQUAL(e.what(), "potential deadlock detected: mutex1 -> mutex2 -> mutex1");
        error_thrown = true;
    }
    BOOST_CHECK(LockStackEmpty());
    #ifdef DEBUG_LOCKORDER
    BOOST_CHECK(error_thrown);
    #else
    BOOST_CHECK(!error_thrown);
    #endif
}